

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall
Gluco::SimpSolver::merge(SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Gluco::Lit> *out_clause)

{
  vec<Gluco::Lit> *pvVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Clause *local_90;
  Clause *local_88;
  Lit local_7c;
  int local_78;
  Lit local_74;
  int local_70;
  int local_6c;
  Lit local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int j;
  int i;
  Clause *qs;
  Clause *ps;
  vec<Gluco::Lit> *pvStack_38;
  bool ps_smallest;
  vec<Gluco::Lit> *out_clause_local;
  Clause *pCStack_28;
  Var v_local;
  Clause *_qs_local;
  Clause *_ps_local;
  SimpSolver *this_local;
  
  this->merges = this->merges + 1;
  pvStack_38 = out_clause;
  out_clause_local._4_4_ = v;
  pCStack_28 = _qs;
  _qs_local = _ps;
  _ps_local = (Clause *)this;
  vec<Gluco::Lit>::clear(out_clause,false);
  iVar3 = Clause::size(_qs_local);
  iVar4 = Clause::size(pCStack_28);
  ps._7_1_ = iVar3 < iVar4;
  if ((bool)ps._7_1_) {
    local_88 = pCStack_28;
  }
  else {
    local_88 = _qs_local;
  }
  qs = local_88;
  if ((bool)ps._7_1_) {
    local_90 = _qs_local;
  }
  else {
    local_90 = pCStack_28;
  }
  _j = local_90;
  local_54 = 0;
  do {
    iVar3 = local_54;
    iVar4 = Clause::size(_j);
    if (iVar4 <= iVar3) {
      for (local_54 = 0; iVar3 = local_54, iVar4 = Clause::size(qs), iVar3 < iVar4;
          local_54 = local_54 + 1) {
        local_78 = (int)Clause::operator[](qs,local_54);
        iVar3 = Gluco::var((Lit)local_78);
        pvVar1 = pvStack_38;
        if (iVar3 != out_clause_local._4_4_) {
          local_7c = Clause::operator[](qs,local_54);
          vec<Gluco::Lit>::push(pvVar1,&local_7c);
        }
      }
      return true;
    }
    local_5c = (int)Clause::operator[](_j,local_54);
    iVar3 = Gluco::var((Lit)local_5c);
    if (iVar3 != out_clause_local._4_4_) {
      for (local_58 = 0; iVar3 = local_58, iVar4 = Clause::size(qs), pvVar1 = pvStack_38,
          iVar3 < iVar4; local_58 = local_58 + 1) {
        local_60 = (int)Clause::operator[](qs,local_58);
        iVar3 = Gluco::var((Lit)local_60);
        local_64 = (int)Clause::operator[](_j,local_54);
        iVar4 = Gluco::var((Lit)local_64);
        if (iVar3 == iVar4) {
          local_68 = Clause::operator[](qs,local_58);
          local_70 = (int)Clause::operator[](_j,local_54);
          local_6c = (int)operator~((Lit)local_70);
          bVar2 = Gluco::Lit::operator==(&local_68,(Lit)local_6c);
          if (bVar2) {
            return false;
          }
          goto LAB_0073a10d;
        }
      }
      local_74 = Clause::operator[](_j,local_54);
      vec<Gluco::Lit>::push(pvVar1,&local_74);
    }
LAB_0073a10d:
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    int i, j;
    for (i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])) {
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}